

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O2

void obj_extract_self(obj *obj)

{
  monst *obj_00;
  uint uVar1;
  obj **head_ptr;
  long lVar2;
  vptrs *pvVar3;
  
  switch(obj->where) {
  case '\0':
    return;
  case '\x01':
    remove_object(obj);
    return;
  case '\x02':
    pvVar3 = &obj->v;
    extract_nobj(obj,&((obj->v).v_nexthere)->cobj);
    do {
      obj_00 = pvVar3->v_ocarry;
      uVar1 = weight((obj *)obj_00);
      obj_00->mhp = uVar1;
      pvVar3 = (vptrs *)&obj_00->data;
    } while (obj_00->mtrack[2].x == '\x02');
    return;
  case '\x03':
    freeinv(obj);
    return;
  case '\x04':
    head_ptr = &((obj->v).v_ocarry)->minvent;
    goto LAB_001d74c6;
  case '\x05':
    lVar2 = 0xb808;
    break;
  case '\x06':
    lVar2 = 0xb810;
    break;
  case '\a':
    head_ptr = &magic_chest_objs;
    goto LAB_001d74c6;
  default:
    panic("obj_extract_self");
  }
  head_ptr = (obj **)(obj->olev->levname + lVar2);
LAB_001d74c6:
  extract_nobj(obj,head_ptr);
  return;
}

Assistant:

void obj_extract_self(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_FREE:
	    break;
	case OBJ_FLOOR:
	    remove_object(obj);
	    break;
	case OBJ_CONTAINED:
	    extract_nobj(obj, &obj->ocontainer->cobj);
	    container_weight(obj->ocontainer);
	    break;
	case OBJ_INVENT:
	    freeinv(obj);
	    break;
	case OBJ_MINVENT:
	    extract_nobj(obj, &obj->ocarry->minvent);
	    break;
	case OBJ_BURIED:
	    extract_nobj(obj, &obj->olev->buriedobjlist);
	    break;
	case OBJ_ONBILL:
	    extract_nobj(obj, &obj->olev->billobjs);
	    break;
	case OBJ_MAGIC_CHEST:
	    extract_nobj(obj, &magic_chest_objs);
	    break;
	default:
	    panic("obj_extract_self");
	    break;
    }
}